

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3RenameTokenMap(Parse *pParse,void *pPtr,Token *pToken)

{
  undefined8 *puVar1;
  undefined8 *in_RDX;
  void *in_RSI;
  long in_RDI;
  RenameToken *pNew;
  u64 in_stack_ffffffffffffffd8;
  
  if ((*(char *)(in_RDI + 0x134) != '\x03') &&
     (puVar1 = (undefined8 *)
               sqlite3DbMallocZero((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffd8),
     puVar1 != (undefined8 *)0x0)) {
    *puVar1 = in_RSI;
    puVar1[1] = *in_RDX;
    puVar1[2] = in_RDX[1];
    puVar1[3] = *(undefined8 *)(in_RDI + 0x1a0);
    *(undefined8 **)(in_RDI + 0x1a0) = puVar1;
  }
  return in_RSI;
}

Assistant:

SQLITE_PRIVATE const void *sqlite3RenameTokenMap(
  Parse *pParse,
  const void *pPtr,
  const Token *pToken
){
  RenameToken *pNew;
  assert( pPtr || pParse->db->mallocFailed );
  renameTokenCheckAll(pParse, pPtr);
  if( ALWAYS(pParse->eParseMode!=PARSE_MODE_UNMAP) ){
    pNew = sqlite3DbMallocZero(pParse->db, sizeof(RenameToken));
    if( pNew ){
      pNew->p = pPtr;
      pNew->t = *pToken;
      pNew->pNext = pParse->pRename;
      pParse->pRename = pNew;
    }
  }

  return pPtr;
}